

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O2

REF_STATUS ref_swap_pass(REF_GRID ref_grid)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  REF_INT *pRVar2;
  REF_INT *pRVar3;
  bool bVar4;
  REF_STATUS RVar5;
  uint uVar6;
  long lVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  int cell;
  bool bVar13;
  int local_160;
  REF_INT tet0;
  REF_INT found;
  REF_INT tet1;
  long local_150;
  REF_INT face_nodes [4];
  REF_INT cell_nodes [4];
  REF_INT found_nodes [27];
  REF_INT tri_nodes [27];
  
  pRVar1 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  ref_cell_00 = ref_grid->cell[8];
  cell = 0;
  do {
    if (ref_cell->max <= cell) {
      return 0;
    }
    RVar5 = ref_cell_nodes(ref_cell,cell,tri_nodes);
    if (RVar5 == 0) {
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        face_nodes[lVar7] = tri_nodes[lVar7];
      }
      face_nodes[3] = face_nodes[0];
      uVar6 = ref_cell_with_face(ref_cell_00,face_nodes,&tet0,&tet1);
      if (uVar6 != 0) {
        pcVar12 = "unable to find tets with face";
        uVar8 = 0xc6;
LAB_001ee9de:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               uVar8,"ref_swap_pass",(ulong)uVar6,pcVar12);
        return uVar6;
      }
      if ((long)tet0 == -1) {
        pcVar12 = "boundary tet missing";
        uVar8 = 199;
LAB_001ee9b2:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               uVar8,"ref_swap_pass",pcVar12);
        return 1;
      }
      if (tet1 != -1) {
        pcVar12 = "boundary tri has two tets, not manifold";
        uVar8 = 200;
        goto LAB_001ee9b2;
      }
      iVar9 = ref_grid->mpi->id;
      pRVar2 = pRVar1->part;
      pRVar3 = ref_cell_00->c2n;
      lVar7 = (long)ref_cell_00->size_per * (long)tet0;
      if ((((iVar9 == pRVar2[pRVar3[lVar7]]) && (iVar9 == pRVar2[pRVar3[lVar7 + 1]])) &&
          (iVar9 == pRVar2[pRVar3[lVar7 + 2]])) && (iVar9 == pRVar2[pRVar3[lVar7 + 3]])) {
        lVar10 = 0;
        local_160 = -1;
        iVar9 = -1;
        bVar4 = false;
        for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
          pRVar2 = ref_cell_00->c2n;
          pRVar3 = ref_cell_00->f2n;
          for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
            cell_nodes[lVar11] =
                 pRVar2[(long)ref_cell_00->size_per * (long)tet0 +
                        (long)*(int *)((long)pRVar3 + lVar11 * 4 + lVar10)];
          }
          RVar5 = ref_cell_with(ref_cell,cell_nodes,&found);
          if (RVar5 == 0) {
            local_150 = lVar7;
            uVar6 = ref_cell_nodes(ref_cell,found,found_nodes);
            if (uVar6 != 0) {
              pcVar12 = "tri";
              uVar8 = 0xd9;
              goto LAB_001ee9de;
            }
            lVar7 = local_150;
            if (local_160 == -1) {
              local_160 = found_nodes[3];
            }
            else {
              bVar13 = iVar9 != -1;
              iVar9 = found_nodes[3];
              if (bVar13) {
                bVar4 = true;
              }
            }
          }
          lVar10 = lVar10 + 0x10;
        }
        if (((iVar9 != -1 && local_160 != -1) && (local_160 == iVar9)) &&
           ((!bVar4 && (uVar6 = ref_swap_remove_two_face_cell(ref_grid,tet0), uVar6 != 0)))) {
          pcVar12 = "remove it";
          uVar8 = 0xe7;
          goto LAB_001ee9de;
        }
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_swap_pass(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_CELL tet = ref_grid_tet(ref_grid);
  REF_INT tri_index, tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT i, face_nodes[4];
  REF_INT tet0, tet1;
  REF_INT faceid0, faceid1;
  REF_BOOL more_than_two;
  REF_INT cell_face, node, cell_nodes[4];
  REF_INT found, found_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT rank;

  each_ref_cell_valid_cell_with_nodes(tri, tri_index, tri_nodes) {
    for (i = 0; i < 3; i++) face_nodes[i] = tri_nodes[i];
    face_nodes[3] = face_nodes[0];
    RSS(ref_cell_with_face(tet, face_nodes, &tet0, &tet1),
        "unable to find tets with face");
    if (REF_EMPTY == tet0) THROW("boundary tet missing");
    if (REF_EMPTY != tet1) THROW("boundary tri has two tets, not manifold");

    /* must be local to swap */
    rank = ref_mpi_rank(ref_grid_mpi(ref_grid));
    if (rank != ref_node_part(ref_node, ref_cell_c2n(tet, 0, tet0)) ||
        rank != ref_node_part(ref_node, ref_cell_c2n(tet, 1, tet0)) ||
        rank != ref_node_part(ref_node, ref_cell_c2n(tet, 2, tet0)) ||
        rank != ref_node_part(ref_node, ref_cell_c2n(tet, 3, tet0)))
      continue;

    faceid0 = REF_EMPTY;
    faceid1 = REF_EMPTY;
    more_than_two = REF_FALSE;
    for (cell_face = 0; cell_face < 4; cell_face++) {
      for (node = 0; node < 4; node++)
        cell_nodes[node] = ref_cell_f2n(tet, node, cell_face, tet0);
      if (REF_SUCCESS == ref_cell_with(tri, cell_nodes, &found)) {
        RSS(ref_cell_nodes(tri, found, found_nodes), "tri");
        if (REF_EMPTY == faceid0) {
          faceid0 = found_nodes[3];
        } else {
          if (REF_EMPTY != faceid1) {
            more_than_two = REF_TRUE;
          }
          faceid1 = found_nodes[3];
        }
      }
    }
    if (REF_EMPTY == faceid0 || REF_EMPTY == faceid1 || faceid0 != faceid1 ||
        more_than_two)
      continue;
    RSS(ref_swap_remove_two_face_cell(ref_grid, tet0), "remove it");
  }
  return REF_SUCCESS;
}